

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O3

void __thiscall
btMultiBody::fillConstraintJacobianMultiDof
          (btMultiBody *this,int link,btVector3 *contact_point,btVector3 *normal_ang,
          btVector3 *normal_lin,btScalar *jac,btAlignedObjectArray<float> *scratch_r,
          btAlignedObjectArray<btVector3> *scratch_v,btAlignedObjectArray<btMatrix3x3> *scratch_m)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  btMatrix3x3 *pbVar8;
  float *ptr;
  btMultibodyLink *pbVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  btVector3 *pbVar17;
  btMatrix3x3 *pbVar18;
  btVector3 *pbVar19;
  float *pfVar20;
  btVector3 *pbVar21;
  ulong uVar22;
  int iVar23;
  long lVar24;
  btScalar *pbVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  btScalar *pbVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  btMatrix3x3 mtx;
  float *local_f8;
  btMatrix3x3 local_a8;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_78._8_8_ = local_78._0_8_;
  local_78._0_8_ = contact_point;
  iVar23 = (this->m_links).m_size;
  iVar7 = this->m_dofCount;
  lVar26 = (long)iVar23 * 3 + 3;
  uVar16 = scratch_v->m_size;
  iVar29 = (int)lVar26;
  local_68._8_8_ = local_68._0_8_;
  local_68._0_8_ = (long)iVar23;
  if (((int)uVar16 < iVar29) && (scratch_v->m_capacity < iVar29)) {
    if (iVar29 == 0) {
      pbVar17 = (btVector3 *)0x0;
    }
    else {
      pbVar17 = (btVector3 *)btAlignedAllocInternal(lVar26 * 0x10,0x10);
      uVar16 = scratch_v->m_size;
    }
    if (0 < (int)uVar16) {
      lVar26 = 0;
      do {
        puVar1 = (undefined8 *)((long)scratch_v->m_data->m_floats + lVar26);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar17->m_floats + lVar26);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar26 = lVar26 + 0x10;
      } while ((ulong)uVar16 << 4 != lVar26);
    }
    if ((scratch_v->m_data != (btVector3 *)0x0) && (scratch_v->m_ownsMemory == true)) {
      btAlignedFreeInternal(scratch_v->m_data);
    }
    scratch_v->m_ownsMemory = true;
    scratch_v->m_data = pbVar17;
    scratch_v->m_capacity = iVar29;
    iVar23 = local_68._0_4_;
  }
  scratch_v->m_size = iVar29;
  iVar29 = iVar23 + 1;
  uVar16 = scratch_m->m_size;
  lVar26 = (long)iVar29;
  if (((int)uVar16 <= iVar23) && (scratch_m->m_capacity <= iVar23)) {
    if (iVar29 == 0) {
      pbVar18 = (btMatrix3x3 *)0x0;
    }
    else {
      pbVar18 = (btMatrix3x3 *)btAlignedAllocInternal(lVar26 * 0x30,0x10);
      uVar16 = scratch_m->m_size;
    }
    if (0 < (int)uVar16) {
      lVar24 = 0;
      do {
        pbVar8 = scratch_m->m_data;
        puVar1 = (undefined8 *)((long)pbVar8->m_el[0].m_floats + lVar24);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar18->m_el[0].m_floats + lVar24);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar1 = (undefined8 *)((long)pbVar8->m_el[1].m_floats + lVar24);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)pbVar18->m_el[1].m_floats + lVar24);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        puVar2 = (undefined8 *)((long)pbVar8->m_el[2].m_floats + lVar24);
        uVar5 = puVar2[1];
        puVar1 = (undefined8 *)((long)pbVar18->m_el[2].m_floats + lVar24);
        *puVar1 = *puVar2;
        puVar1[1] = uVar5;
        lVar24 = lVar24 + 0x30;
      } while ((ulong)uVar16 * 0x30 != lVar24);
    }
    if ((scratch_m->m_data != (btMatrix3x3 *)0x0) && (scratch_m->m_ownsMemory == true)) {
      btAlignedFreeInternal(scratch_m->m_data);
    }
    scratch_m->m_ownsMemory = true;
    scratch_m->m_data = pbVar18;
    scratch_m->m_capacity = iVar29;
  }
  scratch_m->m_size = iVar29;
  pbVar17 = scratch_v->m_data;
  pbVar19 = pbVar17 + lVar26;
  uVar16 = scratch_r->m_size;
  if (iVar7 <= (int)uVar16) goto LAB_001b9862;
  lVar24 = (long)(int)uVar16;
  if (scratch_r->m_capacity < iVar7) {
    if (iVar7 == 0) {
      pfVar20 = (float *)0x0;
    }
    else {
      pfVar20 = (float *)btAlignedAllocInternal((long)iVar7 * 4,0x10);
      uVar16 = scratch_r->m_size;
    }
    ptr = scratch_r->m_data;
    if ((int)uVar16 < 1) {
      if (ptr != (float *)0x0) goto LAB_001b982f;
    }
    else {
      uVar22 = 0;
      do {
        pfVar20[uVar22] = ptr[uVar22];
        uVar22 = uVar22 + 1;
      } while (uVar16 != uVar22);
LAB_001b982f:
      if (scratch_r->m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
    }
    scratch_r->m_ownsMemory = true;
    scratch_r->m_data = pfVar20;
    scratch_r->m_capacity = iVar7;
  }
  else {
    pfVar20 = scratch_r->m_data;
  }
  memset(pfVar20 + lVar24,0,(iVar7 - lVar24) * 4);
LAB_001b9862:
  pbVar21 = pbVar19 + lVar26;
  scratch_r->m_size = iVar7;
  if (iVar7 < 1) {
    local_f8 = (float *)0x0;
  }
  else {
    local_f8 = scratch_r->m_data;
  }
  pbVar18 = scratch_m->m_data;
  local_48 = ZEXT416((uint)(*(float *)(local_78._0_8_ + 4) - (this->m_basePos).m_floats[1]));
  local_58 = ZEXT416((uint)(*(float *)(local_78._0_8_ + 8) - (this->m_basePos).m_floats[2]));
  local_78 = ZEXT416((uint)(*(float *)local_78._0_8_ - (this->m_basePos).m_floats[0]));
  btMatrix3x3::setRotation(&local_a8,&this->m_baseQuat);
  *(ulong *)pbVar18->m_el[0].m_floats =
       CONCAT44(local_a8.m_el[0].m_floats[1],local_a8.m_el[0].m_floats[0]);
  *(ulong *)(pbVar18->m_el[0].m_floats + 2) =
       CONCAT44(local_a8.m_el[0].m_floats[3],local_a8.m_el[0].m_floats[2]);
  *(ulong *)pbVar18->m_el[1].m_floats =
       CONCAT44(local_a8.m_el[1].m_floats[1],local_a8.m_el[1].m_floats[0]);
  *(ulong *)(pbVar18->m_el[1].m_floats + 2) =
       CONCAT44(local_a8.m_el[1].m_floats[3],local_a8.m_el[1].m_floats[2]);
  *(ulong *)pbVar18->m_el[2].m_floats =
       CONCAT44(local_a8.m_el[2].m_floats[1],local_a8.m_el[2].m_floats[0]);
  *(ulong *)(pbVar18->m_el[2].m_floats + 2) =
       CONCAT44(local_a8.m_el[2].m_floats[3],local_a8.m_el[2].m_floats[2]);
  fVar31 = normal_lin->m_floats[2];
  fVar3 = normal_lin->m_floats[0];
  fVar4 = normal_lin->m_floats[1];
  *jac = ((float)local_48._0_4_ * fVar31 - fVar4 * (float)local_58._0_4_) + normal_ang->m_floats[0];
  jac[1] = ((float)local_58._0_4_ * fVar3 - fVar31 * (float)local_78._0_4_) +
           normal_ang->m_floats[1];
  jac[2] = (fVar4 * (float)local_78._0_4_ - fVar3 * (float)local_48._0_4_) + normal_ang->m_floats[2]
  ;
  jac[3] = normal_lin->m_floats[0];
  jac[4] = normal_lin->m_floats[1];
  jac[5] = normal_lin->m_floats[2];
  auVar10._4_4_ =
       (float)local_58._0_4_ * pbVar18->m_el[1].m_floats[2] +
       (float)local_78._0_4_ * pbVar18->m_el[1].m_floats[0] +
       pbVar18->m_el[1].m_floats[1] * (float)local_48._0_4_;
  auVar10._0_4_ =
       (float)local_58._0_4_ * pbVar18->m_el[0].m_floats[2] +
       (float)local_78._0_4_ * pbVar18->m_el[0].m_floats[0] +
       pbVar18->m_el[0].m_floats[1] * (float)local_48._0_4_;
  auVar10._8_4_ =
       (float)local_58._0_4_ * pbVar18->m_el[2].m_floats[2] +
       (float)local_78._0_4_ * pbVar18->m_el[2].m_floats[0] +
       (float)local_48._0_4_ * pbVar18->m_el[2].m_floats[1];
  auVar10._12_4_ = 0;
  *(undefined1 (*) [16])pbVar17->m_floats = auVar10;
  fVar31 = normal_lin->m_floats[0];
  fVar3 = normal_lin->m_floats[1];
  fVar4 = normal_lin->m_floats[2];
  auVar13._4_4_ =
       fVar4 * pbVar18->m_el[1].m_floats[2] +
       fVar31 * pbVar18->m_el[1].m_floats[0] + pbVar18->m_el[1].m_floats[1] * fVar3;
  auVar13._0_4_ =
       fVar4 * pbVar18->m_el[0].m_floats[2] +
       fVar31 * pbVar18->m_el[0].m_floats[0] + pbVar18->m_el[0].m_floats[1] * fVar3;
  auVar13._8_4_ =
       fVar4 * pbVar18->m_el[2].m_floats[2] +
       fVar31 * pbVar18->m_el[2].m_floats[0] + fVar3 * pbVar18->m_el[2].m_floats[1];
  auVar13._12_4_ = 0;
  *(undefined1 (*) [16])pbVar19->m_floats = auVar13;
  fVar31 = normal_ang->m_floats[0];
  fVar3 = normal_ang->m_floats[1];
  fVar4 = normal_ang->m_floats[2];
  auVar14._4_4_ =
       fVar4 * pbVar18->m_el[1].m_floats[2] +
       fVar31 * pbVar18->m_el[1].m_floats[0] + pbVar18->m_el[1].m_floats[1] * fVar3;
  auVar14._0_4_ =
       fVar4 * pbVar18->m_el[0].m_floats[2] +
       fVar31 * pbVar18->m_el[0].m_floats[0] + pbVar18->m_el[0].m_floats[1] * fVar3;
  auVar14._8_4_ =
       fVar4 * pbVar18->m_el[2].m_floats[2] +
       fVar31 * pbVar18->m_el[2].m_floats[0] + fVar3 * pbVar18->m_el[2].m_floats[1];
  auVar14._12_4_ = 0;
  *(undefined1 (*) [16])pbVar21->m_floats = auVar14;
  if (0 < iVar7) {
    iVar23 = 6;
    if (6 < iVar7 + 5) {
      iVar23 = iVar7 + 5;
    }
    memset(jac + 6,0,(ulong)(iVar23 - 5) << 2);
  }
  if (-1 < link && 0 < local_68._0_4_) {
    lVar24 = local_68._0_8_ * 600;
    pbVar30 = pbVar17[1].m_floats + 2;
    pbVar25 = pbVar18[1].m_el[2].m_floats + 3;
    lVar28 = 0;
    do {
      pbVar9 = (this->m_links).m_data;
      iVar23 = *(int *)((long)(pbVar9->m_zeroRotParentToThis).super_btQuadWord.m_floats +
                       lVar28 + -4);
      btMatrix3x3::setRotation
                (&local_a8,
                 (btQuaternion *)
                 ((long)(pbVar9->m_cachedRotParentToThis).super_btQuadWord.m_floats + lVar28));
      lVar27 = (long)iVar23 + 1;
      fVar31 = pbVar18[lVar27].m_el[0].m_floats[2];
      fVar3 = pbVar18[lVar27].m_el[1].m_floats[2];
      fVar4 = pbVar18[lVar27].m_el[2].m_floats[2];
      local_68 = ZEXT416((uint)local_a8.m_el[1].m_floats[0]);
      uVar5 = *(undefined8 *)pbVar18[lVar27].m_el[0].m_floats;
      uVar6 = *(undefined8 *)pbVar18[lVar27].m_el[1].m_floats;
      fVar34 = (float)uVar6;
      fVar35 = (float)((ulong)uVar6 >> 0x20);
      fVar32 = (float)uVar5;
      fVar33 = (float)((ulong)uVar5 >> 0x20);
      uVar5 = *(undefined8 *)pbVar18[lVar27].m_el[2].m_floats;
      fVar36 = (float)uVar5;
      fVar37 = (float)((ulong)uVar5 >> 0x20);
      *(ulong *)(pbVar25 + -0xb) =
           CONCAT44(local_a8.m_el[0].m_floats[2] * fVar37 +
                    local_a8.m_el[0].m_floats[0] * fVar33 + local_a8.m_el[0].m_floats[1] * fVar35,
                    local_a8.m_el[0].m_floats[2] * fVar36 +
                    local_a8.m_el[0].m_floats[0] * fVar32 + local_a8.m_el[0].m_floats[1] * fVar34);
      pbVar25[-9] = fVar4 * local_a8.m_el[0].m_floats[2] +
                    fVar31 * local_a8.m_el[0].m_floats[0] + local_a8.m_el[0].m_floats[1] * fVar3;
      pbVar25[-8] = 0.0;
      *(ulong *)(pbVar25 + -7) =
           CONCAT44(local_a8.m_el[1].m_floats[2] * fVar37 +
                    local_a8.m_el[1].m_floats[0] * fVar33 + local_a8.m_el[1].m_floats[1] * fVar35,
                    local_a8.m_el[1].m_floats[2] * fVar36 +
                    local_a8.m_el[1].m_floats[0] * fVar32 + local_a8.m_el[1].m_floats[1] * fVar34);
      pbVar25[-5] = fVar4 * local_a8.m_el[1].m_floats[2] +
                    fVar31 * local_a8.m_el[1].m_floats[0] + fVar3 * local_a8.m_el[1].m_floats[1];
      pbVar25[-4] = 0.0;
      *(ulong *)((btVector3 *)(pbVar25 + -3))->m_floats =
           CONCAT44(local_a8.m_el[2].m_floats[2] * fVar37 +
                    local_a8.m_el[2].m_floats[0] * fVar33 + local_a8.m_el[2].m_floats[1] * fVar35,
                    local_a8.m_el[2].m_floats[2] * fVar36 +
                    local_a8.m_el[2].m_floats[0] * fVar32 + local_a8.m_el[2].m_floats[1] * fVar34);
      pbVar25[-1] = fVar4 * local_a8.m_el[2].m_floats[2] +
                    fVar31 * local_a8.m_el[2].m_floats[0] + fVar3 * local_a8.m_el[2].m_floats[1];
      *pbVar25 = 0.0;
      fVar31 = pbVar19[lVar27].m_floats[0];
      fVar3 = pbVar19[lVar27].m_floats[1];
      fVar4 = pbVar19[lVar27].m_floats[2];
      auVar15._4_4_ =
           fVar4 * local_a8.m_el[1].m_floats[2] +
           fVar31 * local_a8.m_el[1].m_floats[0] + fVar3 * local_a8.m_el[1].m_floats[1];
      auVar15._0_4_ =
           fVar4 * local_a8.m_el[0].m_floats[2] +
           fVar31 * local_a8.m_el[0].m_floats[0] + fVar3 * local_a8.m_el[0].m_floats[1];
      auVar15._8_4_ =
           fVar3 * local_a8.m_el[2].m_floats[1] + local_a8.m_el[2].m_floats[0] * fVar31 +
           local_a8.m_el[2].m_floats[2] * fVar4;
      auVar15._12_4_ = 0;
      *(undefined1 (*) [16])(pbVar30 + lVar26 * 4 + -2) = auVar15;
      fVar31 = pbVar21[lVar27].m_floats[0];
      fVar3 = pbVar21[lVar27].m_floats[1];
      fVar4 = pbVar21[lVar27].m_floats[2];
      auVar12._4_4_ =
           fVar4 * local_a8.m_el[1].m_floats[2] +
           fVar31 * local_a8.m_el[1].m_floats[0] + fVar3 * local_a8.m_el[1].m_floats[1];
      auVar12._0_4_ =
           fVar4 * local_a8.m_el[0].m_floats[2] +
           fVar31 * local_a8.m_el[0].m_floats[0] + fVar3 * local_a8.m_el[0].m_floats[1];
      auVar12._8_4_ =
           fVar3 * local_a8.m_el[2].m_floats[1] + local_a8.m_el[2].m_floats[0] * fVar31 +
           local_a8.m_el[2].m_floats[2] * fVar4;
      auVar12._12_4_ = 0;
      *(undefined1 (*) [16])(pbVar30 + lVar26 * 8 + -2) = auVar12;
      fVar31 = pbVar17[lVar27].m_floats[0];
      fVar3 = pbVar17[lVar27].m_floats[1];
      fVar4 = pbVar17[lVar27].m_floats[2];
      pbVar9 = (this->m_links).m_data;
      uVar5 = *(undefined8 *)((long)(pbVar9->m_cachedRVector).m_floats + lVar28);
      fVar32 = (fVar4 * local_a8.m_el[0].m_floats[2] +
               fVar31 * local_a8.m_el[0].m_floats[0] + local_a8.m_el[0].m_floats[1] * fVar3) -
               (float)uVar5;
      fVar33 = (fVar4 * local_a8.m_el[1].m_floats[2] +
               fVar31 * local_a8.m_el[1].m_floats[0] + local_a8.m_el[1].m_floats[1] * fVar3) -
               (float)((ulong)uVar5 >> 0x20);
      fVar31 = (local_a8.m_el[2].m_floats[2] * fVar4 +
               local_a8.m_el[2].m_floats[0] * fVar31 + local_a8.m_el[2].m_floats[1] * fVar3) -
               *(float *)((long)(pbVar9->m_cachedRVector).m_floats + lVar28 + 8);
      auVar11._4_4_ = fVar33;
      auVar11._0_4_ = fVar32;
      auVar11._8_4_ = fVar31;
      auVar11._12_4_ = 0;
      *(undefined1 (*) [16])((btVector3 *)(pbVar30 + -2))->m_floats = auVar11;
      pbVar9 = (this->m_links).m_data;
      switch(*(undefined4 *)
              ((long)(pbVar9->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar28 + -0xc)) {
      case 0:
        fVar3 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28);
        fVar4 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 4);
        fVar34 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 8);
        fVar31 = ((fVar33 * fVar3 - fVar32 * fVar4) +
                 *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28 + 8)) *
                 pbVar30[lVar26 * 4] +
                 ((fVar4 * fVar31 - fVar33 * fVar34) +
                 *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28)) *
                 pbVar30[lVar26 * 4 + -2] +
                 ((fVar34 * fVar32 - fVar31 * fVar3) +
                 *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28 + 4)) *
                 pbVar30[lVar26 * 4 + -1];
        iVar23 = *(int *)((long)(pbVar9->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                         lVar28 + -8);
        local_f8[iVar23] = fVar31;
        local_f8[iVar23] =
             pbVar30[lVar26 * 8] *
             *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 8) +
             pbVar30[lVar26 * 8 + -2] *
             *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28) +
             pbVar30[lVar26 * 8 + -1] *
             *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 4) + fVar31;
        break;
      case 1:
        local_f8[*(int *)((long)(pbVar9->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                         lVar28 + -8)] =
             pbVar30[lVar26 * 4] *
             *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28 + 8) +
             pbVar30[lVar26 * 4 + -2] *
             *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28) +
             pbVar30[lVar26 * 4 + -1] *
             *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28 + 4);
        break;
      case 2:
        fVar3 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28);
        fVar4 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 4);
        fVar34 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 8);
        fVar33 = ((fVar33 * fVar3 - fVar32 * fVar4) +
                 *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28 + 8)) *
                 pbVar30[lVar26 * 4] +
                 ((fVar4 * fVar31 - fVar33 * fVar34) +
                 *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28)) *
                 pbVar30[lVar26 * 4 + -2] +
                 ((fVar34 * fVar32 - fVar31 * fVar3) +
                 *(float *)((long)pbVar9->m_axes[0].m_bottomVec.m_floats + lVar28 + 4)) *
                 pbVar30[lVar26 * 4 + -1];
        lVar27 = (long)*(int *)((long)(pbVar9->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                               lVar28 + -8);
        local_f8[lVar27] = fVar33;
        fVar31 = *(float *)((long)pbVar9->m_axes[1].m_topVec.m_floats + lVar28);
        fVar3 = *(float *)((long)pbVar9->m_axes[1].m_topVec.m_floats + lVar28 + 4);
        fVar4 = *(float *)((long)pbVar9->m_axes[1].m_topVec.m_floats + lVar28 + 8);
        fVar32 = ((fVar31 * pbVar30[-1] - ((btVector3 *)(pbVar30 + -2))->m_floats[0] * fVar3) +
                 *(float *)((long)pbVar9->m_axes[1].m_bottomVec.m_floats + lVar28 + 8)) *
                 pbVar30[lVar26 * 4] +
                 ((fVar3 * *pbVar30 - pbVar30[-1] * fVar4) +
                 *(float *)((long)pbVar9->m_axes[1].m_bottomVec.m_floats + lVar28)) *
                 pbVar30[lVar26 * 4 + -2] +
                 ((fVar4 * ((btVector3 *)(pbVar30 + -2))->m_floats[0] - *pbVar30 * fVar31) +
                 *(float *)((long)pbVar9->m_axes[1].m_bottomVec.m_floats + lVar28 + 4)) *
                 pbVar30[lVar26 * 4 + -1];
        local_f8[lVar27 + 1] = fVar32;
        fVar31 = *(float *)((long)pbVar9->m_axes[2].m_topVec.m_floats + lVar28);
        fVar3 = *(float *)((long)pbVar9->m_axes[2].m_topVec.m_floats + lVar28 + 4);
        fVar4 = *(float *)((long)pbVar9->m_axes[2].m_topVec.m_floats + lVar28 + 8);
        fVar31 = ((fVar31 * pbVar30[-1] - ((btVector3 *)(pbVar30 + -2))->m_floats[0] * fVar3) +
                 *(float *)((long)pbVar9->m_axes[2].m_bottomVec.m_floats + lVar28 + 8)) *
                 pbVar30[lVar26 * 4] +
                 ((fVar3 * *pbVar30 - pbVar30[-1] * fVar4) +
                 *(float *)((long)pbVar9->m_axes[2].m_bottomVec.m_floats + lVar28)) *
                 pbVar30[lVar26 * 4 + -2] +
                 ((fVar4 * ((btVector3 *)(pbVar30 + -2))->m_floats[0] - *pbVar30 * fVar31) +
                 *(float *)((long)pbVar9->m_axes[2].m_bottomVec.m_floats + lVar28 + 4)) *
                 pbVar30[lVar26 * 4 + -1];
        local_f8[lVar27 + 2] = fVar31;
        local_f8[lVar27] =
             pbVar30[lVar26 * 8] *
             *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 8) +
             pbVar30[lVar26 * 8 + -2] *
             *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28) +
             pbVar30[lVar26 * 8 + -1] *
             *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 4) + fVar33;
        local_f8[lVar27 + 1] =
             pbVar30[lVar26 * 8] *
             *(float *)((long)pbVar9->m_axes[1].m_topVec.m_floats + lVar28 + 8) +
             pbVar30[lVar26 * 8 + -2] *
             *(float *)((long)pbVar9->m_axes[1].m_topVec.m_floats + lVar28) +
             pbVar30[lVar26 * 8 + -1] *
             *(float *)((long)pbVar9->m_axes[1].m_topVec.m_floats + lVar28 + 4) + fVar32;
        local_f8[lVar27 + 2] =
             pbVar30[lVar26 * 8] *
             *(float *)((long)pbVar9->m_axes[2].m_topVec.m_floats + lVar28 + 8) +
             pbVar30[lVar26 * 8 + -2] *
             *(float *)((long)pbVar9->m_axes[2].m_topVec.m_floats + lVar28) +
             pbVar30[lVar26 * 8 + -1] *
             *(float *)((long)pbVar9->m_axes[2].m_topVec.m_floats + lVar28 + 4) + fVar31;
        break;
      case 3:
        fVar3 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28);
        fVar4 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 4);
        fVar34 = *(float *)((long)pbVar9->m_axes[0].m_topVec.m_floats + lVar28 + 8);
        lVar27 = (long)*(int *)((long)(pbVar9->m_cachedRotParentToThis).super_btQuadWord.m_floats +
                               lVar28 + -8);
        local_f8[lVar27] =
             (fVar33 * fVar3 - fVar32 * fVar4) * pbVar30[lVar26 * 4] +
             (fVar4 * fVar31 - fVar33 * fVar34) * pbVar30[lVar26 * 4 + -2] +
             (fVar34 * fVar32 - fVar31 * fVar3) * pbVar30[lVar26 * 4 + -1];
        local_f8[lVar27 + 1] =
             pbVar30[lVar26 * 4] *
             *(float *)((long)pbVar9->m_axes[1].m_bottomVec.m_floats + lVar28 + 8) +
             pbVar30[lVar26 * 4 + -2] *
             *(float *)((long)pbVar9->m_axes[1].m_bottomVec.m_floats + lVar28) +
             pbVar30[lVar26 * 4 + -1] *
             *(float *)((long)pbVar9->m_axes[1].m_bottomVec.m_floats + lVar28 + 4);
        local_f8[lVar27 + 2] =
             pbVar30[lVar26 * 4] *
             *(float *)((long)pbVar9->m_axes[2].m_bottomVec.m_floats + lVar28 + 8) +
             pbVar30[lVar26 * 4 + -2] *
             *(float *)((long)pbVar9->m_axes[2].m_bottomVec.m_floats + lVar28) +
             pbVar30[lVar26 * 4 + -1] *
             *(float *)((long)pbVar9->m_axes[2].m_bottomVec.m_floats + lVar28 + 4);
      }
      lVar28 = lVar28 + 600;
      pbVar30 = pbVar30 + 4;
      pbVar25 = pbVar25 + 0xc;
    } while (lVar24 != lVar28);
    if (link != -1) {
      pbVar9 = (this->m_links).m_data;
      do {
        iVar23 = pbVar9[link].m_dofCount;
        if (0 < (long)iVar23) {
          iVar7 = pbVar9[link].m_dofOffset;
          lVar26 = 0;
          do {
            jac[iVar7 + 6 + (int)lVar26] = local_f8[iVar7 + lVar26];
            lVar26 = lVar26 + 1;
          } while (iVar23 != lVar26);
        }
        link = pbVar9[link].m_parent;
      } while (link != -1);
    }
  }
  return;
}

Assistant:

void btMultiBody::fillConstraintJacobianMultiDof(int link,
                                    const btVector3 &contact_point,
									const btVector3 &normal_ang,
                                    const btVector3 &normal_lin,
                                    btScalar *jac,
                                    btAlignedObjectArray<btScalar> &scratch_r,
                                    btAlignedObjectArray<btVector3> &scratch_v,
                                    btAlignedObjectArray<btMatrix3x3> &scratch_m) const
{
    // temporary space
	int num_links = getNumLinks();
	int m_dofCount = getNumDofs();
    scratch_v.resize(3*num_links + 3);			//(num_links + base) offsets + (num_links + base) normals_lin + (num_links + base) normals_ang
    scratch_m.resize(num_links + 1);

    btVector3 * v_ptr = &scratch_v[0];
    btVector3 * p_minus_com_local = v_ptr; v_ptr += num_links + 1;
    btVector3 * n_local_lin = v_ptr; v_ptr += num_links + 1;
	btVector3 * n_local_ang = v_ptr; v_ptr += num_links + 1;
    btAssert(v_ptr - &scratch_v[0] == scratch_v.size());

    scratch_r.resize(m_dofCount);
    btScalar * results = m_dofCount > 0 ? &scratch_r[0] : 0;

    btMatrix3x3 * rot_from_world = &scratch_m[0];

    const btVector3 p_minus_com_world = contact_point - m_basePos;
	const btVector3 &normal_lin_world = normal_lin;							//convenience
	const btVector3 &normal_ang_world = normal_ang;

    rot_from_world[0] = btMatrix3x3(m_baseQuat);    
    
    // omega coeffients first.
    btVector3 omega_coeffs_world;
    omega_coeffs_world = p_minus_com_world.cross(normal_lin_world);
	jac[0] = omega_coeffs_world[0] + normal_ang_world[0];
	jac[1] = omega_coeffs_world[1] + normal_ang_world[1];
	jac[2] = omega_coeffs_world[2] + normal_ang_world[2];
    // then v coefficients
    jac[3] = normal_lin_world[0];
    jac[4] = normal_lin_world[1];
    jac[5] = normal_lin_world[2];

	//create link-local versions of p_minus_com and normal
	p_minus_com_local[0] = rot_from_world[0] * p_minus_com_world;
    n_local_lin[0] = rot_from_world[0] * normal_lin_world;
	n_local_ang[0] = rot_from_world[0] * normal_ang_world;

    // Set remaining jac values to zero for now.
    for (int i = 6; i < 6 + m_dofCount; ++i) 
	{
        jac[i] = 0;
    }

    // Qdot coefficients, if necessary.
    if (num_links > 0 && link > -1) {

        // TODO: speed this up -- don't calculate for m_links we don't need.
        // (Also, we are making 3 separate calls to this function, for the normal & the 2 friction directions,
        // which is resulting in repeated work being done...)

        // calculate required normals & positions in the local frames.
        for (int i = 0; i < num_links; ++i) {

            // transform to local frame
            const int parent = m_links[i].m_parent;
            const btMatrix3x3 mtx(m_links[i].m_cachedRotParentToThis);
            rot_from_world[i+1] = mtx * rot_from_world[parent+1];

            n_local_lin[i+1] = mtx * n_local_lin[parent+1];
			n_local_ang[i+1] = mtx * n_local_ang[parent+1];
            p_minus_com_local[i+1] = mtx * p_minus_com_local[parent+1] - m_links[i].m_cachedRVector;

			// calculate the jacobian entry
			switch(m_links[i].m_jointType)
			{
				case btMultibodyLink::eRevolute:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					break;
				}
				case btMultibodyLink::ePrismatic:
				{
					results[m_links[i].m_dofOffset] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(0));
					break;
				}
				case btMultibodyLink::eSpherical:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisTop(1).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisTop(2).cross(p_minus_com_local[i+1]) + m_links[i].getAxisBottom(2));
										
					results[m_links[i].m_dofOffset + 0] += n_local_ang[i+1].dot(m_links[i].getAxisTop(0));
					results[m_links[i].m_dofOffset + 1] += n_local_ang[i+1].dot(m_links[i].getAxisTop(1));
					results[m_links[i].m_dofOffset + 2] += n_local_ang[i+1].dot(m_links[i].getAxisTop(2));

					break;
				}
				case btMultibodyLink::ePlanar:
				{
					results[m_links[i].m_dofOffset + 0] = n_local_lin[i+1].dot(m_links[i].getAxisTop(0).cross(p_minus_com_local[i+1]));// + m_links[i].getAxisBottom(0));
					results[m_links[i].m_dofOffset + 1] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(1));
					results[m_links[i].m_dofOffset + 2] = n_local_lin[i+1].dot(m_links[i].getAxisBottom(2));

					break;
				}
				default:
				{
				}
			}
            
        }

        // Now copy through to output.
		//printf("jac[%d] = ", link);
        while (link != -1) 
		{
			for(int dof = 0; dof < m_links[link].m_dofCount; ++dof)
			{
				jac[6 + m_links[link].m_dofOffset + dof] = results[m_links[link].m_dofOffset + dof];
				//printf("%.2f\t", jac[6 + m_links[link].m_dofOffset + dof]);
			}
            
			link = m_links[link].m_parent;
        }
		//printf("]\n");
    }
}